

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

ContentSpecNode *
xercesc_4_0::makeRepNode(XMLCh testCh,ContentSpecNode *prevNode,MemoryManager *manager)

{
  ContentSpecNode *pCVar1;
  NodeTypes NVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  
  iVar3 = (int)CONCAT62(in_register_0000003a,testCh);
  if (iVar3 == 0x2a) {
    NVar2 = ZeroOrMore;
  }
  else if (iVar3 == 0x3f) {
    NVar2 = ZeroOrOne;
  }
  else {
    if (iVar3 != 0x2b) {
      return prevNode;
    }
    NVar2 = OneOrMore;
  }
  pCVar1 = (ContentSpecNode *)XMemory::operator_new(0x40,manager);
  (pCVar1->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__ContentSpecNode_00418e30;
  pCVar1->fMemoryManager = manager;
  pCVar1->fElement = (QName *)0x0;
  pCVar1->fElementDecl = (XMLElementDecl *)0x0;
  pCVar1->fFirst = prevNode;
  pCVar1->fSecond = (ContentSpecNode *)0x0;
  pCVar1->fType = NVar2;
  pCVar1->fAdoptFirst = true;
  pCVar1->fAdoptSecond = true;
  pCVar1->fMinOccurs = 1;
  pCVar1->fMaxOccurs = 1;
  return pCVar1;
}

Assistant:

static ContentSpecNode* makeRepNode(const XMLCh testCh,
                                    ContentSpecNode* const prevNode,
                                    MemoryManager* const manager)
{
    if (testCh == chQuestion)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::ZeroOrOne
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }
     else if (testCh == chPlus)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::OneOrMore
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }
     else if (testCh == chAsterisk)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::ZeroOrMore
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }

    // Just return the incoming node
    return prevNode;
}